

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxStateByIndex::Resolve(FxStateByIndex *this,FCompileContext *ctx)

{
  int val;
  PClassActor *pPVar1;
  FxConstant *this_00;
  FState *ptr;
  
  this_00 = (FxConstant *)this;
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (ctx->Class == (PStruct *)0x0) {
      this_00 = (FxConstant *)0x0;
    }
    else {
      pPVar1 = dyn_cast<PClassActor>((DObject *)ctx->Class);
      if ((pPVar1 == (PClassActor *)0x0) || (pPVar1->NumOwnedStates < 1)) {
        __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x25f6,"virtual FxExpression *FxStateByIndex::Resolve(FCompileContext &)");
      }
      if (this->index < pPVar1->NumOwnedStates) {
        ptr = pPVar1->OwnedStates + this->index;
        val = FStateLabelStorage::AddPointer(&StateLabels,ptr);
        this_00 = (FxConstant *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ptr);
        FxConstant::FxConstant(this_00,val,&(this->super_FxExpression).ScriptPosition);
        (this_00->super_FxExpression).ValueType = (PType *)TypeStateLabel;
      }
      else {
        this_00 = (FxConstant *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "%s: Attempt to jump to non existing state index %d",
                   FName::NameData.NameArray[(ctx->Class->super_PNamedType).TypeName.Index].Text);
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  }
  return &this_00->super_FxExpression;
}

Assistant:

FxExpression *FxStateByIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	ABORT(ctx.Class);
	auto aclass = dyn_cast<PClassActor>(ctx.Class);

	// This expression type can only be used from actors, for everything else it has already produced a compile error.
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);

	if (aclass->NumOwnedStates <= index)
	{
		ScriptPosition.Message(MSG_ERROR, "%s: Attempt to jump to non existing state index %d", 
			ctx.Class->TypeName.GetChars(), index);
		delete this;
		return nullptr;
	}
	int symlabel = StateLabels.AddPointer(aclass->OwnedStates + index);
	FxExpression *x = new FxConstant(symlabel, ScriptPosition);
	x->ValueType = TypeStateLabel;
	delete this;
	return x;
}